

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenEnumStringTable(CppGenerator *this,EnumDef *enum_def)

{
  bool bVar1;
  uint64_t uVar2;
  size_t sVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  const_reference ppEVar5;
  EnumVal *pEVar6;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  string local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  reference local_4b8;
  EnumVal **ev;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3_1;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  string vals;
  string local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  ulong local_e8;
  uint64_t k;
  EnumVal **enum_value;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3;
  value_type val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  uint64_t local_20;
  uint64_t range;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  range = (uint64_t)enum_def;
  enum_def_local = (EnumDef *)this;
  uVar2 = EnumDef::Distance(enum_def);
  local_20 = uVar2;
  sVar3 = EnumDef::size((EnumDef *)range);
  if (uVar2 / sVar3 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"inline const char * const *EnumNames{{ENUM_NAME}}() {",&local_41
              );
    CodeWriter::operator+=(&this->code_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    NumToString<unsigned_long>((string *)&val,local_20 + 2);
    std::operator+(&local_98,"  static const char * const names[",(string *)&val);
    std::operator+(&local_78,&local_98,"] = {");
    CodeWriter::operator+=(&this->code_,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&val);
    pvVar4 = EnumDef::Vals((EnumDef *)range);
    ppEVar5 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::front
                        (pvVar4);
    __range3 = (vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *)*ppEVar5;
    pvVar4 = EnumDef::Vals((EnumDef *)range);
    __end3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar4);
    enum_value = (EnumVal **)
                 std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                           (pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                       *)&enum_value), bVar1) {
      k = (uint64_t)
          __gnu_cxx::
          __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
          ::operator*(&__end3);
      for (local_e8 = EnumDef::Distance((EnumDef *)range,(EnumVal *)__range3,*(EnumVal **)k);
          1 < local_e8; local_e8 = local_e8 - 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"    \"\",",&local_109);
        CodeWriter::operator+=(&this->code_,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
      }
      __range3 = *(vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> **)k;
      Name_abi_cxx11_(&local_170,this,*(EnumVal **)k);
      std::operator+(&local_150,"    \"",&local_170);
      std::operator+(&local_130,&local_150,"\",");
      CodeWriter::operator+=(&this->code_,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"    nullptr",&local_191);
    CodeWriter::operator+=(&this->code_,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"  };",&local_1b9);
    CodeWriter::operator+=(&this->code_,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"  return names;",&local_1e1);
    CodeWriter::operator+=(&this->code_,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"}",&local_209);
    CodeWriter::operator+=(&this->code_,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"",&local_231);
    CodeWriter::operator+=(&this->code_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {",
               &local_259);
    CodeWriter::operator+=(&this->code_,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    uVar2 = range;
    pEVar6 = EnumDef::MinValue((EnumDef *)range);
    GetEnumValUse_abi_cxx11_(&local_300,this,(EnumDef *)uVar2,pEVar6);
    std::operator+(&local_2e0,"  if (::flatbuffers::IsOutRange(e, ",&local_300);
    std::operator+(&local_2c0,&local_2e0,", ");
    uVar2 = range;
    pEVar6 = EnumDef::MaxValue((EnumDef *)range);
    GetEnumValUse_abi_cxx11_(&local_320,this,(EnumDef *)uVar2,pEVar6);
    std::operator+(&local_2a0,&local_2c0,&local_320);
    std::operator+(&local_280,&local_2a0,")) return \"\";");
    CodeWriter::operator+=(&this->code_,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"  const size_t index = static_cast<size_t>(e)\\",
               (allocator<char> *)(vals.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=(&this->code_,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)(vals.field_2._M_local_buf + 0xf));
    pEVar6 = EnumDef::MinValue((EnumDef *)range);
    bVar1 = EnumVal::IsNonZero(pEVar6);
    uVar2 = range;
    if (bVar1) {
      pEVar6 = EnumDef::MinValue((EnumDef *)range);
      GetEnumValUse_abi_cxx11_((string *)local_368,this,(EnumDef *)uVar2,pEVar6);
      std::operator+(&local_3a8," - static_cast<size_t>(",(string *)local_368);
      std::operator+(&local_388,&local_3a8,")\\");
      CodeWriter::operator+=(&this->code_,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)local_368);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,";",&local_3c9);
    CodeWriter::operator+=(&this->code_,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"  return EnumNames{{ENUM_NAME}}()[index];",&local_3f1);
    CodeWriter::operator+=(&this->code_,&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"}",&local_419);
    CodeWriter::operator+=(&this->code_,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"",&local_441);
    CodeWriter::operator+=(&this->code_,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {",
               &local_469);
    CodeWriter::operator+=(&this->code_,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"  switch (e) {",(allocator<char> *)((long)&__range3_1 + 7));
    CodeWriter::operator+=(&this->code_,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    pvVar4 = EnumDef::Vals((EnumDef *)range);
    __end3_1 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                         (pvVar4);
    ev = (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                               *)&ev), bVar1) {
      local_4b8 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&__end3_1);
      GetEnumValUse_abi_cxx11_(&local_558,this,(EnumDef *)range,*local_4b8);
      std::operator+(&local_538,"    case ",&local_558);
      std::operator+(&local_518,&local_538,": return \"");
      Name_abi_cxx11_(&local_578,this,*local_4b8);
      std::operator+(&local_4f8,&local_518,&local_578);
      std::operator+(&local_4d8,&local_4f8,"\";");
      CodeWriter::operator+=(&this->code_,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&__end3_1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"    default: return \"\";",&local_599);
    CodeWriter::operator+=(&this->code_,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"  }",&local_5c1);
    CodeWriter::operator+=(&this->code_,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"}",&local_5e9);
    CodeWriter::operator+=(&this->code_,&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator(&local_5e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"",&local_611);
    CodeWriter::operator+=(&this->code_,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator(&local_611);
  }
  return;
}

Assistant:

void GenEnumStringTable(const EnumDef &enum_def) {
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness) {
      code_ += "inline const char * const *EnumNames{{ENUM_NAME}}() {";
      code_ += "  static const char * const names[" +
               NumToString(range + 1 + 1) + "] = {";

      auto val = enum_def.Vals().front();
      for (const auto &enum_value : enum_def.Vals()) {
        for (auto k = enum_def.Distance(val, enum_value); k > 1; --k) {
          code_ += "    \"\",";
        }
        val = enum_value;
        code_ += "    \"" + Name(*enum_value) + "\",";
      }
      code_ += "    nullptr";
      code_ += "  };";

      code_ += "  return names;";
      code_ += "}";
      code_ += "";

      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";

      code_ += "  if (::flatbuffers::IsOutRange(e, " +
               GetEnumValUse(enum_def, *enum_def.MinValue()) + ", " +
               GetEnumValUse(enum_def, *enum_def.MaxValue()) +
               ")) return \"\";";

      code_ += "  const size_t index = static_cast<size_t>(e)\\";
      if (enum_def.MinValue()->IsNonZero()) {
        auto vals = GetEnumValUse(enum_def, *enum_def.MinValue());
        code_ += " - static_cast<size_t>(" + vals + ")\\";
      }
      code_ += ";";

      code_ += "  return EnumNames{{ENUM_NAME}}()[index];";
      code_ += "}";
      code_ += "";
    } else {
      code_ += "inline const char *EnumName{{ENUM_NAME}}({{ENUM_NAME}} e) {";
      code_ += "  switch (e) {";
      for (const auto &ev : enum_def.Vals()) {
        code_ += "    case " + GetEnumValUse(enum_def, *ev) + ": return \"" +
                 Name(*ev) + "\";";
      }
      code_ += "    default: return \"\";";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }